

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

void __thiscall TestSuite::TestSuite(TestSuite *this,int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  rep rVar5;
  int iVar6;
  
  (this->options).printTestMessage = false;
  (this->options).abortOnFailure = false;
  (this->options).preserveTestFiles = false;
  this->cntPass = 0;
  this->cntFail = 0;
  (this->filter)._M_dataplus._M_p = (pointer)&(this->filter).field_2;
  (this->filter)._M_string_length = 0;
  (this->filter).field_2._M_local_buf[0] = '\0';
  this->displayMsg = false;
  this->useGivenRange = false;
  this->preserveTestFiles = false;
  this->forceAbortOnFailure = false;
  this->suppressMsg = false;
  this->givenRange = 0;
  (this->startTimeLocal).__d.__r = 0;
  rVar5 = std::chrono::_V2::system_clock::now();
  (this->startTimeGlobal).__d.__r = rVar5;
  if (1 < argc) {
    iVar6 = 1;
    do {
      if (iVar6 < argc + -1) {
        pcVar1 = argv[iVar6];
        iVar3 = strcmp(pcVar1,"-f");
        if (iVar3 != 0) {
          iVar3 = strcmp(pcVar1,"--filter");
          if (iVar3 != 0) goto LAB_00105ca9;
        }
        pcVar1 = argv[(long)iVar6 + 1];
        pcVar2 = (char *)(this->filter)._M_string_length;
        strlen(pcVar1);
        std::__cxx11::string::_M_replace((ulong)&this->filter,0,pcVar2,(ulong)pcVar1);
        iVar6 = iVar6 + 1;
      }
LAB_00105ca9:
      iVar3 = iVar6;
      if (iVar6 < argc + -1) {
        pcVar1 = argv[iVar6];
        iVar4 = strcmp(pcVar1,"-r");
        if (iVar4 != 0) {
          iVar4 = strcmp(pcVar1,"--range");
          if (iVar4 != 0) goto LAB_00105cfa;
        }
        iVar3 = iVar6 + 1;
        iVar6 = atoi(argv[(long)iVar6 + 1]);
        this->givenRange = (long)iVar6;
        this->useGivenRange = true;
      }
LAB_00105cfa:
      pcVar1 = argv[iVar3];
      iVar6 = strcmp(pcVar1,"-p");
      if (iVar6 == 0) {
LAB_00105d27:
        this->preserveTestFiles = true;
      }
      else {
        iVar6 = strcmp(pcVar1,"--preserve");
        if (iVar6 == 0) goto LAB_00105d27;
      }
      iVar6 = strcmp(pcVar1,"--abort-on-failure");
      if (iVar6 == 0) {
        this->forceAbortOnFailure = true;
      }
      iVar6 = strcmp(pcVar1,"--suppress-msg");
      if (iVar6 == 0) {
        this->suppressMsg = true;
      }
      iVar6 = strcmp(pcVar1,"--display-msg");
      if ((iVar6 == 0) && (this->suppressMsg == false)) {
        this->displayMsg = true;
      }
      iVar6 = strcmp(pcVar1,"-h");
      if (iVar6 == 0) {
LAB_00105dbd:
        usage(argc,argv);
        exit(0);
      }
      iVar6 = strcmp(pcVar1,"--help");
      if (iVar6 == 0) goto LAB_00105dbd;
      iVar6 = iVar3 + 1;
    } while (iVar6 < argc);
  }
  return;
}

Assistant:

TestSuite(int argc = 0, char **argv = nullptr)
        : cntPass(0)
        , cntFail(0)
        , useGivenRange(false)
        , preserveTestFiles(false)
        , forceAbortOnFailure(false)
        , suppressMsg(false)
        , displayMsg(false)
        , givenRange(0)
        , startTimeGlobal(std::chrono::system_clock::now())
    {
        for (int ii=1; ii<argc; ++ii) {
            // Filter.
            if ( ii < argc-1 &&
                 (!strcmp(argv[ii], "-f") ||
                  !strcmp(argv[ii], "--filter")) ) {
                filter = argv[++ii];
            }

            // Range.
            if ( ii < argc-1 &&
                 (!strcmp(argv[ii], "-r") ||
                  !strcmp(argv[ii], "--range")) ) {
                givenRange = atoi(argv[++ii]);
                useGivenRange = true;
            }

            // Do not clean up test files after test.
            if ( !strcmp(argv[ii], "-p") ||
                 !strcmp(argv[ii], "--preserve") ) {
                preserveTestFiles = true;
            }

            // Force abort on failure.
            if ( !strcmp(argv[ii], "--abort-on-failure") ) {
                forceAbortOnFailure = true;
            }

            // Suppress test messages.
            if ( !strcmp(argv[ii], "--suppress-msg") ) {
                suppressMsg = true;
            }

            // Display test messages.
            if ( !strcmp(argv[ii], "--display-msg") && !suppressMsg ) {
                displayMsg = true;
            }

            // Help
            if ( !strcmp(argv[ii], "-h") ||
                 !strcmp(argv[ii], "--help") ) {
                usage(argc, argv);
                exit(0);
            }
        }
    }